

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalGenerator::IsExcluded
          (cmGlobalGenerator *this,cmLocalGenerator *root,cmGeneratorTarget *target)

{
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  cmLocalGenerator *gen;
  allocator local_41;
  string local_40;
  
  TVar3 = cmGeneratorTarget::GetType(target);
  bVar2 = true;
  if (TVar3 != INTERFACE_LIBRARY) {
    std::__cxx11::string::string((string *)&local_40,"EXCLUDE_FROM_ALL",&local_41);
    bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (!bVar1) {
      gen = cmGeneratorTarget::GetLocalGenerator(target);
      bVar2 = IsExcluded((cmGlobalGenerator *)target,root,gen);
    }
  }
  return bVar2;
}

Assistant:

bool cmGlobalGenerator::IsExcluded(cmLocalGenerator* root,
                                   cmGeneratorTarget* target) const
{
  if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
      target->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
    // This target is excluded from its directory.
    return true;
  }
  // This target is included in its directory.  Check whether the
  // directory is excluded.
  return this->IsExcluded(root, target->GetLocalGenerator());
}